

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::BringWindowToDisplayFront(ImGuiWindow *window)

{
  ImGuiWindow **ppIVar1;
  ImGuiContext *pIVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  
  pIVar2 = GImGui;
  ppIVar1 = (GImGui->Windows).Data;
  iVar5 = (GImGui->Windows).Size;
  if ((ppIVar1[(long)iVar5 + -1] != window) &&
     (1 < iVar5 && ppIVar1[(long)iVar5 + -1]->RootWindow != window)) {
    uVar4 = (ulong)(iVar5 - 1);
    iVar5 = 1;
    do {
      uVar3 = (int)uVar4 - 1;
      uVar4 = (ulong)uVar3;
      if (ppIVar1[uVar4] == window) {
        memmove(ppIVar1 + uVar4,ppIVar1 + uVar4 + 1,(long)iVar5 << 3);
        (pIVar2->Windows).Data[(long)(pIVar2->Windows).Size + -1] = window;
        return;
      }
      iVar5 = iVar5 + 1;
    } while (0 < (int)uVar3);
  }
  return;
}

Assistant:

void ImGui::BringWindowToDisplayFront(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* current_front_window = g.Windows.back();
    if (current_front_window == window || current_front_window->RootWindow == window)
        return;
    for (int i = g.Windows.Size - 2; i >= 0; i--) // We can ignore the front most window
        if (g.Windows[i] == window)
        {
            memmove(&g.Windows[i], &g.Windows[i + 1], (size_t)(g.Windows.Size - i - 1) * sizeof(ImGuiWindow*));
            g.Windows[g.Windows.Size - 1] = window;
            break;
        }
}